

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf-test.cpp
# Opt level: O2

void U_to_u8_test(int line,UTF_US32 *str1,UTF_S8 *str2,bool ok)

{
  pointer pcVar1;
  int line_00;
  bool bVar2;
  int iVar3;
  UTF_UC8 *pUVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  UTF_US8 tmp;
  UTF_UC8 buf [256];
  UTF_UC8 local_160 [3];
  UTF_UC8 local_15d;
  int local_15c;
  UTF_US8 local_158;
  UTF_UC8 local_138 [264];
  
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  local_158._M_string_length = 0;
  local_158.field_2._M_local_buf[0] = '\0';
  bVar2 = UTF_U_to_u8<(char)63>(str1,&local_158);
  UTF_test(line,bVar2 == ok);
  bVar2 = std::operator==(&local_158,
                          (basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                           *)str2);
  UTF_test(line,bVar2);
  pcVar1 = (str1->_M_dataplus)._M_p;
  lVar8 = str1->_M_string_length << 2;
  lVar7 = 0;
  lVar5 = 0;
  local_15c = line;
  do {
    pUVar4 = local_138 + lVar5;
    if (lVar8 == lVar7) {
LAB_00101bc8:
      line_00 = local_15c;
      *pUVar4 = '\0';
      UTF_test(local_15c,lVar8 == lVar7);
      iVar3 = UTF_uj8_cmpn(local_158._M_dataplus._M_p,local_138,local_158._M_string_length + 1);
      UTF_test(line_00,iVar3 == 0);
      std::__cxx11::
      basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
      ~basic_string(&local_158);
      return;
    }
    bVar2 = UTF_uc32_to_uc8(*(UTF_UC32 *)((long)pcVar1 + lVar7),local_160);
    if (!bVar2) {
      local_160[0] = '?';
      local_160[1] = '\0';
    }
    if (lVar5 == 0xff) goto LAB_00101bc8;
    lVar6 = lVar5 + 1;
    local_138[lVar5] = local_160[0];
    if (local_160[1] != '\0') {
      if (lVar6 == 0xff) {
        pUVar4 = local_138 + lVar5 + 1;
        goto LAB_00101bc8;
      }
      lVar6 = lVar5 + 2;
      local_138[lVar5 + 1] = local_160[1];
      if (local_160[2] != '\0') {
        if (lVar6 == 0xff) {
          pUVar4 = local_138 + lVar5 + 2;
          goto LAB_00101bc8;
        }
        lVar6 = lVar5 + 3;
        local_138[lVar5 + 2] = local_160[2];
        if (local_15d != '\0') {
          if (lVar6 == 0xff) {
            pUVar4 = local_138 + lVar5 + 3;
            goto LAB_00101bc8;
          }
          local_138[lVar5 + 3] = local_15d;
          lVar6 = lVar5 + 4;
        }
      }
    }
    lVar7 = lVar7 + 4;
    lVar5 = lVar6;
  } while( true );
}

Assistant:

void U_to_u8_test(int line, const UTF_US32& str1, const UTF_S8& str2, bool ok)
{
    UTF_US8 tmp;
    UTF_UC8 buf[256];
    UTF_test(line, UTF_U_to_u8<'?'>(str1, tmp) == ok);
    UTF_test(line, tmp == reinterpret_cast<const UTF_US8&>(str2));
    UTF_test(line, UTF_uj32_to_uj8(str1.c_str(), str1.size(), buf, 256) == UTF_SUCCESS);
    UTF_test(line, UTF_uj8_cmpn(tmp.c_str(), buf, UTF_SIZE_T(tmp.size() + 1)) == 0);
}